

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::awaitConnection(AeronArchive *this,TimePoint *deadline)

{
  bool bVar1;
  long lVar2;
  ArchiveException *this_00;
  char *pcVar3;
  allocator local_112;
  allocator local_111;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while( true ) {
    ControlResponsePoller::subscription((ControlResponsePoller *)&local_f0);
    bVar1 = Subscription::isConnected((Subscription *)local_f0._M_dataplus._M_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
    if (bVar1) {
      return;
    }
    lVar2 = std::chrono::_V2::system_clock::now();
    if ((deadline->__d).__r < lVar2) break;
    sched_yield();
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke
              (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->m_conductorInvoker);
  }
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  ControlResponsePoller::subscription((ControlResponsePoller *)local_100);
  std::operator+(&local_70,"failed to establish response connection on ",
                 (string *)(local_100._0_8_ + 0x10));
  std::operator+(&local_50,&local_70,", stream id: ");
  ControlResponsePoller::subscription((ControlResponsePoller *)local_110);
  std::__cxx11::to_string(&local_90,*(int32_t *)(local_110._0_8_ + 0x48));
  std::operator+(&local_f0,&local_50,&local_90);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "void aeron::archive::AeronArchive::awaitConnection(const TimePoint &)",&local_111);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_112);
  ArchiveException::ArchiveException(this_00,&local_f0,&local_b0,&local_d0,0x157);
  __cxa_throw(this_00,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

void AeronArchive::awaitConnection(const TimePoint& deadline) {
    while (!controlResponsePoller_->subscription()->isConnected()) {
        if (Clock::now() > deadline) {
            throw ArchiveException(
                "failed to establish response connection on " + controlResponsePoller_->subscription()->channel() +
                    ", stream id: " + std::to_string(controlResponsePoller_->subscription()->streamId()),
                SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}